

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_diff.cpp
# Opt level: O2

long __thiscall
duckdb::DateDiffTernaryOperator::Operation<duckdb::string_t,duckdb::date_t,duckdb::date_t,long>
          (DateDiffTernaryOperator *this,string_t part,date_t startdate,date_t enddate,
          ValidityMask *mask,idx_t idx)

{
  bool bVar1;
  DatePartSpecifier DVar2;
  long lVar3;
  NotImplementedException *this_00;
  date_t input;
  undefined4 in_register_00000084;
  allocator local_71;
  string_t part_local;
  string local_60;
  string local_40;
  
  part_local.value.pointer.ptr = (char *)part.value._0_8_;
  input.days = part.value._8_4_;
  part_local.value._0_8_ = this;
  bVar1 = Value::IsFinite<duckdb::date_t>(input);
  if ((bVar1) && (bVar1 = Value::IsFinite<duckdb::date_t>(startdate), bVar1)) {
    string_t::GetString_abi_cxx11_(&local_60,&part_local);
    DVar2 = GetDatePartSpecifier(&local_60);
    switch(DVar2) {
    case BEGIN_BIGINT:
      lVar3 = DateDiff::YearOperator::Operation<duckdb::date_t,duckdb::date_t,long>(input,startdate)
      ;
      break;
    case MONTH:
      lVar3 = DateDiff::MonthOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case DAY:
    case DOW:
    case ISODOW:
    case DOY:
    case JULIAN_DAY:
      lVar3 = DateDiff::DayOperator::Operation<duckdb::date_t,duckdb::date_t,long>(input,startdate);
      break;
    case DECADE:
      lVar3 = DateDiff::DecadeOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case CENTURY:
      lVar3 = DateDiff::CenturyOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case MILLENNIUM:
      lVar3 = DateDiff::MilleniumOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case MICROSECONDS:
      lVar3 = DateDiff::MicrosecondsOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case MILLISECONDS:
      lVar3 = DateDiff::MillisecondsOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case SECOND:
    case BEGIN_DOUBLE:
      lVar3 = DateDiff::SecondsOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case MINUTE:
      lVar3 = DateDiff::MinutesOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case HOUR:
      lVar3 = DateDiff::HoursOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case WEEK:
    case YEARWEEK:
      lVar3 = (long)((startdate.days - input.days) / 7);
      break;
    case ISOYEAR:
      lVar3 = DateDiff::ISOYearOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case QUARTER:
      lVar3 = DateDiff::QuarterOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    default:
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_40,"Specifier type not implemented for DATEDIFF",&local_71);
      NotImplementedException::NotImplementedException(this_00,&local_40);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              ((TemplatedValidityMask<unsigned_long> *)CONCAT44(in_register_00000084,enddate.days),
               (idx_t)mask);
    lVar3 = 0;
  }
  return lVar3;
}

Assistant:

static inline TR Operation(TS part, TA startdate, TB enddate, ValidityMask &mask, idx_t idx) {
		if (Value::IsFinite(startdate) && Value::IsFinite(enddate)) {
			return DifferenceDates<TA, TB, TR>(GetDatePartSpecifier(part.GetString()), startdate, enddate);
		} else {
			mask.SetInvalid(idx);
			return TR();
		}
	}